

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O1

void __thiscall Time::add(Time *this,TimeDependent *object)

{
  pointer *pppTVar1;
  pointer ppTVar2;
  iterator __position;
  bool bVar3;
  uint uVar4;
  TimeDependent *local_8;
  
  ppTVar2 = (this->timeObjects).
            super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  __position._M_current =
       (this->timeObjects).super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  uVar4 = 0;
  bVar3 = false;
  do {
    if ((ulong)((long)__position._M_current - (long)ppTVar2 >> 3) <= (ulong)uVar4) {
      if (__position._M_current !=
          (this->timeObjects).super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        *__position._M_current = object;
        pppTVar1 = &(this->timeObjects).
                    super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
        return;
      }
      local_8 = object;
      std::vector<TimeDependent*,std::allocator<TimeDependent*>>::
      _M_realloc_insert<TimeDependent*const&>
                ((vector<TimeDependent*,std::allocator<TimeDependent*>> *)&this->timeObjects,
                 __position,&local_8);
      return;
    }
    if (ppTVar2[uVar4] == object) {
      bVar3 = true;
    }
    uVar4 = uVar4 + 1;
  } while (!bVar3);
  return;
}

Assistant:

void Time::add( class TimeDependent *object )
{
	// find object in already registered objects
	bool found = false;
	for (uint i=0; !found && i<timeObjects.size(); ++i)
		if (timeObjects[i] == object)
			found = true;

	// add if not found
	if (!found)
		timeObjects.push_back( object );
}